

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O2

Rgba __thiscall EnvmapImage::filteredLookup(EnvmapImage *this,V3f *d,float r,int n)

{
  Box2i *pBVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  ulong uVar5;
  Rgba RVar6;
  int iVar7;
  undefined4 in_register_00000014;
  int iVar8;
  ulong uVar9;
  int iVar10;
  float fVar11;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar12;
  float local_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  Vec3<float> local_e8;
  Rgba c;
  Vec3<float> local_c8;
  ulong local_b8;
  EnvmapImage *local_b0;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  ulong local_98;
  code *local_90;
  Vec3<float> local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  local_b8 = CONCAT44(in_register_00000014,n);
  local_90 = anon_unknown.dwarf_7463::dirToPosCube;
  if (this->_type == ENVMAP_LATLONG) {
    local_90 = anon_unknown.dwarf_7463::dirToPosLatLong;
  }
  local_b0 = this;
  local_a8 = r;
  uStack_a4 = in_XMM0_Db;
  uStack_a0 = in_XMM0_Dc;
  uStack_9c = in_XMM0_Dd;
  Imath_3_2::Vec3<float>::normalize(d);
  if (ABS(d->x) <= 0.707) {
    local_88.x = 1.0;
    local_88.y = 0.0;
  }
  else {
    local_88.x = 0.0;
    local_88.y = 1.0;
  }
  local_88.z = 0.0;
  Imath_3_2::Vec3<float>::operator%(d,&local_88);
  Imath_3_2::Vec3<float>::normalized(&local_c8);
  fVar12 = local_a8;
  fVar11 = local_c8.x;
  local_c8.z = local_c8.z * local_a8;
  local_c8.y = local_c8.y * local_a8;
  local_c8.x = fVar11 * local_a8;
  Imath_3_2::Vec3<float>::operator%(d,&local_c8);
  Imath_3_2::Vec3<float>::normalized(&local_e8);
  local_78 = local_e8.x * fVar12;
  fStack_74 = local_e8.y * fVar12;
  fStack_70 = fVar12 * 0.0;
  fStack_6c = fVar12 * 0.0;
  iVar4 = (int)local_b8;
  local_a8 = local_a8 * local_e8.z;
  pBVar1 = &local_b0->_dataWindow;
  uVar5 = 0;
  iVar7 = 0;
  if (0 < iVar4) {
    iVar7 = iVar4;
  }
  local_f8 = 0.0;
  fStack_f4 = 0.0;
  fStack_f0 = 0.0;
  fStack_ec = 0.0;
  local_100 = 0.0;
  while ((int)uVar5 != iVar7) {
    fVar12 = (float)((int)uVar5 * 2 + 2) / (float)(iVar4 + 1) + -1.0;
    local_68 = local_a8 * fVar12;
    uStack_64 = uStack_a4;
    uStack_60 = uStack_a0;
    uStack_5c = uStack_9c;
    local_58 = fVar12 * local_78;
    fStack_54 = fVar12 * fStack_74;
    fStack_50 = fVar12 * fStack_70;
    fStack_4c = fVar12 * fStack_6c;
    iVar10 = 2;
    uVar9 = local_b8 & 0xffffffff;
    local_98 = uVar5;
    while (iVar8 = (int)uVar9, uVar9 = (ulong)(iVar8 - 1), iVar8 != 0) {
      fVar11 = (float)iVar10 / (float)(iVar4 + 1) + -1.0;
      local_48 = ZEXT416((uint)(1.0 - ABS(fVar11)));
      local_e8.z = local_c8.z * fVar11 + d->z + local_68;
      uVar2 = d->x;
      uVar3 = d->y;
      local_e8.y = (float)uVar3 + fVar11 * local_c8.y + fStack_54;
      local_e8.x = (float)uVar2 + fVar11 * local_c8.x + local_58;
      (*local_90)(&local_88,pBVar1,&local_e8);
      RVar6 = sample(local_b0,(V2f *)&local_88);
      fVar11 = (float)local_48._0_4_ * (1.0 - ABS(fVar12));
      local_100 = local_100 + fVar11;
      local_f8 = local_f8 +
                 fVar11 * *(float *)(_imath_half_to_float_table + ((ulong)RVar6 >> 0x30) * 4);
      fStack_f4 = fStack_f4 +
                  fVar11 * *(float *)(_imath_half_to_float_table + (ulong)(RVar6._4_4_ & 0xffff) * 4
                                     );
      fStack_f0 = fStack_f0 +
                  fVar11 * *(float *)(_imath_half_to_float_table + (ulong)(RVar6._0_4_ >> 0x10) * 4)
      ;
      fStack_ec = fStack_ec +
                  fVar11 * *(float *)(_imath_half_to_float_table + (ulong)(RVar6._0_4_ & 0xffff) * 4
                                     );
      iVar10 = iVar10 + 2;
    }
    uVar5 = (ulong)((int)local_98 + 1);
  }
  local_100 = 1.0 / local_100;
  Imath_3_2::half::operator=(&c.r,fStack_ec * local_100);
  Imath_3_2::half::operator=(&c.g,fStack_f0 * local_100);
  Imath_3_2::half::operator=(&c.b,fStack_f4 * local_100);
  Imath_3_2::half::operator=(&c.a,local_100 * local_f8);
  return c;
}

Assistant:

Rgba
EnvmapImage::filteredLookup (V3f d, float r, int n) const
{
    //
    // Filtered environment map lookup: Take n by n point samples
    // from the environment map, clustered around direction d, and
    // combine the samples with a tent filter.
    //

    //
    // Depending on the type of map, pick an appropriate function
    // to convert 3D directions to 2D pixel poitions.
    //

    V2f (*dirToPos) (const Box2i&, const V3f&);

    if (_type == ENVMAP_LATLONG)
        dirToPos = dirToPosLatLong;
    else
        dirToPos = dirToPosCube;

    //
    // Pick two vectors, dx and dy, of length r, that are orthogonal
    // to the lookup direction, d, and to each other.
    //

    d.normalize ();
    V3f dx, dy;

    if (abs (d.x) > 0.707f)
        dx = (d % V3f (0, 1, 0)).normalized () * r;
    else
        dx = (d % V3f (1, 0, 0)).normalized () * r;

    dy = (d % dx).normalized () * r;

    //
    // Take n by n point samples from the map, and add them up.
    // The directions for the point samples are all within the pyramid
    // defined by the vectors d-dy-dx, d-dy+dx, d+dy-dx, d+dy+dx.
    //

    float wt = 0;

    float cr = 0;
    float cg = 0;
    float cb = 0;
    float ca = 0;

    for (int y = 0; y < n; ++y)
    {
        float ry = float (2 * y + 2) / float (n + 1) - 1;
        float wy = 1 - abs (ry);
        V3f   ddy (ry * dy);

        for (int x = 0; x < n; ++x)
        {
            float rx = float (2 * x + 2) / float (n + 1) - 1;
            float wx = 1 - abs (rx);
            V3f   ddx (rx * dx);

            Rgba s = sample (dirToPos (_dataWindow, d + ddx + ddy));

            float w = wx * wy;
            wt += w;

            cr += s.r * w;
            cg += s.g * w;
            cb += s.b * w;
            ca += s.a * w;
        }
    }

    wt = 1 / wt;

    Rgba c;

    c.r = cr * wt;
    c.g = cg * wt;
    c.b = cb * wt;
    c.a = ca * wt;

    return c;
}